

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupAndCones(Gia_Man_t *p,int *pAnds,int nAnds,int fTrimPis)

{
  Gia_Obj_t *pGVar1;
  char *pcVar2;
  void *pvVar3;
  Vec_Ptr_t *vLeaves;
  void **ppvVar4;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vRoots;
  Gia_Man_t *p_00;
  size_t sVar5;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *pVVar8;
  Gia_Obj_t *pGVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  uint iCtrl;
  uint uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  
  vLeaves = (Vec_Ptr_t *)malloc(0x10);
  vLeaves->nCap = 100;
  vLeaves->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  vLeaves->pArray = ppvVar4;
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  vNodes->pArray = ppvVar4;
  vRoots = (Vec_Ptr_t *)malloc(0x10);
  vRoots->nCap = 100;
  vRoots->nSize = 0;
  ppvVar4 = (void **)malloc(800);
  vRoots->pArray = ppvVar4;
  if (0 < nAnds) {
    iVar10 = 0;
    uVar18 = 100;
    uVar13 = 0;
    do {
      iVar14 = pAnds[uVar13];
      if (((long)iVar14 < 0) || (p->nObjs <= iVar14)) goto LAB_006b6edc;
      pGVar1 = p->pObjs;
      iVar17 = (int)uVar18;
      if (iVar10 == iVar17) {
        if (iVar17 < 0x10) {
          if (vRoots->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(vRoots->pArray,0x80);
          }
          vRoots->pArray = ppvVar4;
          vRoots->nCap = 0x10;
          uVar18 = 0x10;
        }
        else {
          uVar18 = (ulong)(uint)(iVar17 * 2);
          if (vRoots->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(uVar18 * 8);
          }
          else {
            ppvVar4 = (void **)realloc(vRoots->pArray,uVar18 * 8);
          }
          vRoots->pArray = ppvVar4;
          vRoots->nCap = iVar17 * 2;
        }
      }
      else {
        ppvVar4 = vRoots->pArray;
      }
      iVar17 = vRoots->nSize;
      iVar10 = iVar17 + 1;
      vRoots->nSize = iVar10;
      ppvVar4[iVar17] = pGVar1 + iVar14;
      uVar13 = uVar13 + 1;
    } while ((uint)nAnds != uVar13);
  }
  Gia_ManIncrementTravId(p);
  if (p->nObjs < 1) {
LAB_006b6ebd:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->nTravIdsAlloc < 1) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x23a,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  *p->pTravIds = p->nTravIds;
  iVar10 = vRoots->nSize;
  if (0 < iVar10) {
    lVar16 = 0;
    do {
      Gia_ManDupCones_rec(p,(Gia_Obj_t *)vRoots->pArray[lVar16],vLeaves,vNodes,vRoots);
      lVar16 = lVar16 + 1;
      iVar10 = vRoots->nSize;
    } while (lVar16 < iVar10);
  }
  iVar14 = vLeaves->nSize;
  if (1 < (long)iVar14) {
    qsort(vLeaves->pArray,(long)iVar14,8,Gia_ObjCompareByCioId);
    iVar14 = vLeaves->nSize;
    iVar10 = vRoots->nSize;
  }
  p_00 = Gia_ManStart(iVar10 + iVar14 + vNodes->nSize + 1);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar2);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar2);
  }
  p_00->pName = pcVar6;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar2);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar2);
  }
  p_00->pSpec = pcVar6;
  p->pObjs->Value = 0;
  if (fTrimPis == 0) {
    pVVar8 = p->vCis;
    uVar13 = (ulong)(uint)pVVar8->nSize;
    if (p->nRegs < pVVar8->nSize) {
      lVar16 = 0;
      do {
        if ((int)uVar13 <= lVar16) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar10 = pVVar8->pArray[lVar16];
        if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_006b6edc;
        pGVar1 = p->pObjs;
        if (pGVar1 == (Gia_Obj_t *)0x0) break;
        pGVar9 = Gia_ManAppendObj(p_00);
        uVar13 = *(ulong *)pGVar9;
        *(ulong *)pGVar9 = uVar13 | 0x9fffffff;
        *(ulong *)pGVar9 =
             uVar13 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar7 = p_00->pObjs;
        if ((pGVar9 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar9)) goto LAB_006b6ebd;
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar7) >> 2) * -0x55555555);
        pGVar7 = p_00->pObjs;
        if ((pGVar9 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar9)) goto LAB_006b6ebd;
        pGVar1[iVar10].Value = (int)((ulong)((long)pGVar9 - (long)pGVar7) >> 2) * 0x55555556;
        lVar16 = lVar16 + 1;
        pVVar8 = p->vCis;
        uVar13 = (ulong)pVVar8->nSize;
      } while (lVar16 < (long)(uVar13 - (long)p->nRegs));
    }
  }
  else if (0 < vLeaves->nSize) {
    lVar16 = 0;
    do {
      pvVar3 = vLeaves->pArray[lVar16];
      pGVar7 = Gia_ManAppendObj(p_00);
      uVar13 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar1 = p_00->pObjs;
      if ((pGVar7 < pGVar1) || (pGVar1 + p_00->nObjs <= pGVar7)) goto LAB_006b6ebd;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar1) >> 2) * -0x55555555);
      pGVar1 = p_00->pObjs;
      if ((pGVar7 < pGVar1) || (pGVar1 + p_00->nObjs <= pGVar7)) goto LAB_006b6ebd;
      *(int *)((long)pvVar3 + 8) = (int)((ulong)((long)pGVar7 - (long)pGVar1) >> 2) * 0x55555556;
      lVar16 = lVar16 + 1;
    } while (lVar16 < vLeaves->nSize);
  }
  if (0 < vNodes->nSize) {
    lVar16 = 0;
    do {
      pGVar1 = (Gia_Obj_t *)vNodes->pArray[lVar16];
      pGVar7 = p->pObjs;
      if ((pGVar1 < pGVar7) || (pGVar7 + p->nObjs <= pGVar1)) goto LAB_006b6ebd;
      if ((p->pMuxes == (uint *)0x0) ||
         (uVar11 = p->pMuxes[(int)((ulong)((long)pGVar1 - (long)pGVar7) >> 2) * -0x55555555],
         uVar11 == 0)) {
        uVar13 = *(ulong *)pGVar1;
        uVar18 = uVar13 & 0x1fffffff;
        uVar11 = (uint)(uVar13 >> 0x20);
        if ((uVar18 != 0x1fffffff && -1 < (int)(uint)uVar13) &&
           (((uint)uVar13 & 0x1fffffff) < (uVar11 & 0x1fffffff))) {
          if (((int)pGVar1[-uVar18].Value < 0) ||
             ((int)pGVar1[-(ulong)(uVar11 & 0x1fffffff)].Value < 0)) goto LAB_006b6efb;
          iCtrl = pGVar1[-uVar18].Value ^ (uint)(uVar13 >> 0x1d) & 1;
          uVar11 = pGVar1[-(ulong)(uVar11 & 0x1fffffff)].Value ^ uVar11 >> 0x1d & 1;
          uVar12 = uVar11 ^ 1;
          goto LAB_006b6dc5;
        }
        if (((int)pGVar1[-uVar18].Value < 0) ||
           ((int)pGVar1[-(ulong)(uVar11 & 0x1fffffff)].Value < 0)) goto LAB_006b6efb;
        uVar11 = Gia_ManAppendAnd(p_00,pGVar1[-uVar18].Value ^ (uint)(uVar13 >> 0x1d) & 1,
                                  pGVar1[-(ulong)(uVar11 & 0x1fffffff)].Value ^ uVar11 >> 0x1d & 1);
      }
      else {
        if ((int)uVar11 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf2,"int Abc_Lit2Var(int)");
        }
        if (p->nObjs <= (int)(uVar11 >> 1)) {
LAB_006b6edc:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if ((int)pGVar7[uVar11 >> 1].Value < 0) {
LAB_006b6efb:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf5,"int Abc_LitNotCond(int, int)");
        }
        uVar12 = (uint)(*(ulong *)pGVar1 >> 0x20);
        if ((int)pGVar1[-(ulong)(uVar12 & 0x1fffffff)].Value < 0) goto LAB_006b6efb;
        uVar15 = (uint)*(ulong *)pGVar1;
        if ((int)pGVar1[-(ulong)(uVar15 & 0x1fffffff)].Value < 0) goto LAB_006b6efb;
        iCtrl = pGVar7[uVar11 >> 1].Value ^ uVar11 & 1;
        uVar12 = uVar12 >> 0x1d & 1 ^ pGVar1[-(ulong)(uVar12 & 0x1fffffff)].Value;
        uVar11 = pGVar1[-(ulong)(uVar15 & 0x1fffffff)].Value ^ uVar15 >> 0x1d & 1;
LAB_006b6dc5:
        uVar11 = Gia_ManAppendMux(p_00,iCtrl,uVar12,uVar11);
      }
      pGVar1->Value = uVar11;
      lVar16 = lVar16 + 1;
    } while (lVar16 < vNodes->nSize);
  }
  if (0 < vRoots->nSize) {
    lVar16 = 0;
    do {
      Gia_ManAppendCo(p_00,*(int *)((long)vRoots->pArray[lVar16] + 8));
      lVar16 = lVar16 + 1;
    } while (lVar16 < vRoots->nSize);
  }
  Gia_ManSetRegNum(p_00,0);
  if (vLeaves->pArray != (void **)0x0) {
    free(vLeaves->pArray);
  }
  free(vLeaves);
  if (vNodes->pArray != (void **)0x0) {
    free(vNodes->pArray);
  }
  free(vNodes);
  if (vRoots->pArray != (void **)0x0) {
    free(vRoots->pArray);
  }
  free(vRoots);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupAndCones( Gia_Man_t * p, int * pAnds, int nAnds, int fTrimPis )
{
    Gia_Man_t * pNew;
    Vec_Ptr_t * vLeaves, * vNodes, * vRoots;
    Gia_Obj_t * pObj;
    int i;

    // collect initial POs
    vLeaves = Vec_PtrAlloc( 100 );
    vNodes = Vec_PtrAlloc( 100 );
    vRoots = Vec_PtrAlloc( 100 );
    for ( i = 0; i < nAnds; i++ )
//        Vec_PtrPush( vRoots, Gia_ManPo(p, pPos[i]) );
        Vec_PtrPush( vRoots, Gia_ManObj(p, pAnds[i]) );

    // mark internal nodes
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Vec_PtrForEachEntry( Gia_Obj_t *, vRoots, pObj, i )
        Gia_ManDupCones_rec( p, pObj, vLeaves, vNodes, vRoots );
    Vec_PtrSort( vLeaves, (int (*)(void))Gia_ObjCompareByCioId );

    // start the new manager
//    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Vec_PtrSize(vLeaves) + Vec_PtrSize(vNodes) + Vec_PtrSize(vRoots) + 1);
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // map the constant node
    Gia_ManConst0(p)->Value = 0;
    // create PIs
    if ( fTrimPis )
    {
        Vec_PtrForEachEntry( Gia_Obj_t *, vLeaves, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    else
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    // create LOs
//    Vec_PtrForEachEntryStart( Gia_Obj_t *, vRoots, pObj, i, nPos )
//        Gia_ObjRiToRo(p, pObj)->Value = Gia_ManAppendCi( pNew );
    // create internal nodes
    Vec_PtrForEachEntry( Gia_Obj_t *, vNodes, pObj, i )
        if ( Gia_ObjIsMux(p, pObj) )
            pObj->Value = Gia_ManAppendMux( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManAppendXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else 
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // create COs
    Vec_PtrForEachEntry( Gia_Obj_t *, vRoots, pObj, i )
//        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        Gia_ManAppendCo( pNew, pObj->Value );
    // finalize
//    Gia_ManSetRegNum( pNew, Vec_PtrSize(vRoots)-nPos );
    Gia_ManSetRegNum( pNew, 0 );
    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vNodes );
    Vec_PtrFree( vRoots );
    return pNew;

}